

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePartFunction<duckdb::date_t>(DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *pVVar1;
  undefined1 *puVar2;
  VectorType VVar3;
  VectorType VVar4;
  undefined4 uVar5;
  unsigned_long *puVar6;
  long *plVar7;
  SelectionVector *count;
  data_ptr_t pdVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var10;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var11;
  sel_t *psVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  byte bVar15;
  element_type *peVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  reference vector;
  reference vector_00;
  long lVar18;
  TemplatedValidityData<unsigned_long> *pTVar19;
  SelectionVector *pSVar20;
  SelectionVector *pSVar21;
  _Head_base<0UL,_unsigned_long_*,_false> _Var22;
  ulong uVar23;
  data_ptr_t pdVar24;
  ulong uVar25;
  data_ptr_t pdVar26;
  idx_t idx_in_entry;
  SelectionVector *pSVar27;
  ulong uVar28;
  data_ptr_t pdVar29;
  UnifiedVectorFormat ldata;
  data_ptr_t local_130;
  ulong local_128;
  UnifiedVectorFormat local_e8;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar3 = vector->vector_type;
  VVar4 = vector_00->vector_type;
  if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar7 = (long *)result->data;
    if (((puVar6 == (unsigned_long *)0x0) || ((*puVar6 & 1) != 0)) &&
       ((puVar6 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar6 == (unsigned_long *)0x0 || ((*puVar6 & 1) != 0)))) {
      lVar18 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                         (*(undefined8 *)vector->data,*(undefined8 *)(vector->data + 8),
                          *(undefined4 *)vector_00->data,&result->validity,0);
      *plVar7 = lVar18;
      return;
    }
  }
  else {
    count = (SelectionVector *)args->count;
    if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
      pdVar8 = vector_00->data;
      puVar6 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar29 = vector->data;
      if ((puVar6 == (unsigned_long *)0x0) || ((*puVar6 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar26 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_78);
          pdVar24 = local_e8.data;
          pSVar27 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar27;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar24;
          if ((p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var10.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar19->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var10.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var10.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar2 = (undefined1 *)
                     ((long)&count[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if (puVar2 < (undefined1 *)0x40) {
              return;
            }
            uVar23 = 0;
            pSVar27 = (SelectionVector *)0x0;
            do {
              puVar6 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar6 == (unsigned_long *)0x0) {
                pSVar20 = (SelectionVector *)
                          &pSVar27[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar20) {
                  pSVar20 = count;
                }
LAB_00ed485a:
                pSVar21 = pSVar27;
                if (pSVar27 < pSVar20) {
                  uVar5 = *(undefined4 *)pdVar8;
                  pdVar24 = pdVar29 + (long)pSVar27 * 0x10 + 8;
                  do {
                    lVar18 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                       (*(undefined8 *)(pdVar24 + -8),*(undefined8 *)pdVar24,uVar5,
                                        pVVar1,pSVar27);
                    *(long *)(pdVar26 + (long)pSVar27 * 8) = lVar18;
                    pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
                    pdVar24 = pdVar24 + 0x10;
                    pSVar21 = pSVar20;
                  } while (pSVar20 != pSVar27);
                }
              }
              else {
                uVar28 = puVar6[uVar23];
                pSVar20 = (SelectionVector *)
                          &pSVar27[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar20) {
                  pSVar20 = count;
                }
                pSVar21 = pSVar20;
                if (uVar28 != 0) {
                  if (uVar28 == 0xffffffffffffffff) goto LAB_00ed485a;
                  pSVar21 = pSVar27;
                  if (pSVar27 < pSVar20) {
                    pdVar24 = pdVar29 + (long)pSVar27 * 0x10 + 8;
                    uVar25 = 0;
                    do {
                      if ((uVar28 >> (uVar25 & 0x3f) & 1) != 0) {
                        lVar18 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                           (*(undefined8 *)(pdVar24 + -8),*(undefined8 *)pdVar24,
                                            *(undefined4 *)pdVar8,pVVar1,
                                            (long)&pSVar27->sel_vector + uVar25);
                        *(long *)(pdVar26 + uVar25 * 8 + (long)pSVar27 * 8) = lVar18;
                      }
                      uVar25 = uVar25 + 1;
                      pdVar24 = pdVar24 + 0x10;
                      pSVar21 = pSVar20;
                    } while ((long)pSVar20 - (long)pSVar27 != uVar25);
                  }
                }
              }
              uVar23 = uVar23 + 1;
              pSVar27 = pSVar21;
              if (uVar23 == (ulong)puVar2 >> 6) {
                return;
              }
            } while( true );
          }
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar5 = *(undefined4 *)pdVar8;
        pdVar29 = pdVar29 + 8;
        pSVar27 = (SelectionVector *)0x0;
        do {
          lVar18 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                             (*(undefined8 *)(pdVar29 + -8),*(undefined8 *)pdVar29,uVar5,pVVar1,
                              pSVar27);
          *(long *)(pdVar26 + (long)pSVar27 * 8) = lVar18;
          pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
          pdVar29 = pdVar29 + 0x10;
        } while (count != pSVar27);
        return;
      }
    }
    else {
      if ((VVar3 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar4 != FLAT_VECTOR) {
        if (VVar4 != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_e8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          Vector::ToUnifiedFormat(vector,(idx_t)count,&local_e8);
          Vector::ToUnifiedFormat(vector_00,(idx_t)count,&local_78);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar8 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar1 = &result->validity;
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              _Var11._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&(local_e8.sel)->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              psVar12 = (local_78.sel)->sel_vector;
              pSVar27 = (SelectionVector *)0x0;
              do {
                pSVar20 = pSVar27;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var11._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar20 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var11._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar27 * 4);
                }
                pSVar21 = pSVar27;
                if (psVar12 != (sel_t *)0x0) {
                  pSVar21 = (SelectionVector *)(ulong)psVar12[(long)pSVar27];
                }
                uVar14._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_e8.data + pSVar20 * 0x10))->_M_use_count;
                uVar14._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_e8.data + pSVar20 * 0x10))->_M_weak_count;
                lVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_e8.data + pSVar20 * 0x10))->_vptr__Sp_counted_base,
                                    uVar14,*(undefined4 *)(local_78.data + (long)pSVar21 * 4),pVVar1
                                    ,pSVar27);
                *(long *)(pdVar8 + (long)pSVar27 * 8) = lVar18;
                pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
              } while (count != pSVar27);
            }
          }
          else if (count != (SelectionVector *)0x0) {
            _Var11._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&(local_e8.sel)->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            psVar12 = (local_78.sel)->sel_vector;
            pSVar27 = (SelectionVector *)0x0;
            do {
              pSVar20 = pSVar27;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var11._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar20 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var11._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar27 * 4);
              }
              pSVar21 = pSVar27;
              if (psVar12 != (sel_t *)0x0) {
                pSVar21 = (SelectionVector *)(ulong)psVar12[(long)pSVar27];
              }
              if (((local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar20 >> 6] >> ((ulong)pSVar20 & 0x3f) & 1) != 0)) &&
                 ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar21 >> 6] >> ((ulong)pSVar21 & 0x3f) & 1) != 0)))) {
                uVar13._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_e8.data + pSVar20 * 0x10))->_M_use_count;
                uVar13._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_e8.data + pSVar20 * 0x10))->_M_weak_count;
                lVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_e8.data + pSVar20 * 0x10))->_vptr__Sp_counted_base,
                                    uVar13,*(undefined4 *)(local_78.data + (long)pSVar21 * 4),pVVar1
                                    ,pSVar27);
                *(long *)(pdVar8 + (long)pSVar27 * 8) = lVar18;
              }
              else {
                _Var22._M_head_impl =
                     (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (_Var22._M_head_impl == (unsigned_long *)0x0) {
                  local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_98,&local_80);
                  p_Var17 = p_Stack_90;
                  peVar16 = local_98;
                  local_98 = (element_type *)0x0;
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar16;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var17;
                  if ((p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9),
                     p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                  }
                  pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var22._M_head_impl =
                       (pTVar19->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       _Var22._M_head_impl;
                }
                bVar15 = (byte)pSVar27 & 0x3f;
                _Var22._M_head_impl[(ulong)pSVar27 >> 6] =
                     _Var22._M_head_impl[(ulong)pSVar27 >> 6] &
                     (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
              }
              pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
            } while (count != pSVar27);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_e8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          return;
        }
        local_130 = vector->data;
        pdVar8 = vector_00->data;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar29 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_78);
          pdVar26 = local_e8.data;
          pSVar27 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar27;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar26;
          if ((p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var10.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar19->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var10.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var10.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            FlatVector::VerifyFlatVector(vector_00);
            ValidityMask::Combine(pVVar1,&vector_00->validity,(idx_t)count);
            _Var22._M_head_impl = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask
            ;
            goto LAB_00ed506f;
          }
        }
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          _Var22._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_78);
          pdVar26 = local_e8.data;
          pSVar27 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar27;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar26;
          if ((p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var22._M_head_impl =
               (pTVar19->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var22._M_head_impl;
LAB_00ed506f:
        if (_Var22._M_head_impl == (unsigned_long *)0x0) {
          if (count != (SelectionVector *)0x0) {
            local_130 = local_130 + 8;
            pSVar27 = (SelectionVector *)0x0;
            do {
              lVar18 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                 (*(undefined8 *)(local_130 + -8),*(undefined8 *)local_130,
                                  *(undefined4 *)(pdVar8 + (long)pSVar27 * 4),pVVar1,pSVar27);
              *(long *)(pdVar29 + (long)pSVar27 * 8) = lVar18;
              pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
              local_130 = local_130 + 0x10;
            } while (count != pSVar27);
          }
        }
        else {
          puVar2 = (undefined1 *)
                   ((long)&count[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if ((undefined1 *)0x3f < puVar2) {
            local_128 = 0;
            pSVar27 = (SelectionVector *)0x0;
            do {
              puVar6 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar6 == (unsigned_long *)0x0) {
                pSVar20 = (SelectionVector *)
                          &pSVar27[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar20) {
                  pSVar20 = count;
                }
LAB_00ed50ea:
                pSVar21 = pSVar27;
                if (pSVar27 < pSVar20) {
                  pdVar26 = local_130 + (long)pSVar27 * 0x10 + 8;
                  do {
                    lVar18 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                       (*(undefined8 *)(pdVar26 + -8),*(undefined8 *)pdVar26,
                                        *(undefined4 *)(pdVar8 + (long)pSVar27 * 4),pVVar1,pSVar27);
                    *(long *)(pdVar29 + (long)pSVar27 * 8) = lVar18;
                    pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
                    pdVar26 = pdVar26 + 0x10;
                    pSVar21 = pSVar20;
                  } while (pSVar20 != pSVar27);
                }
              }
              else {
                uVar23 = puVar6[local_128];
                pSVar20 = (SelectionVector *)
                          &pSVar27[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar20) {
                  pSVar20 = count;
                }
                pSVar21 = pSVar20;
                if (uVar23 != 0) {
                  if (uVar23 == 0xffffffffffffffff) goto LAB_00ed50ea;
                  pSVar21 = pSVar27;
                  if (pSVar27 < pSVar20) {
                    pdVar26 = local_130 + (long)pSVar27 * 0x10 + 8;
                    uVar28 = 0;
                    do {
                      if ((uVar23 >> (uVar28 & 0x3f) & 1) != 0) {
                        lVar18 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                           (*(undefined8 *)(pdVar26 + -8),*(undefined8 *)pdVar26,
                                            *(undefined4 *)(pdVar8 + uVar28 * 4 + (long)pSVar27 * 4)
                                            ,pVVar1,(long)&pSVar27->sel_vector + uVar28);
                        *(long *)(pdVar29 + uVar28 * 8 + (long)pSVar27 * 8) = lVar18;
                      }
                      uVar28 = uVar28 + 1;
                      pdVar26 = pdVar26 + 0x10;
                      pSVar21 = pSVar20;
                    } while ((long)pSVar20 - (long)pSVar27 != uVar28);
                  }
                }
              }
              local_128 = local_128 + 1;
              pSVar27 = pSVar21;
            } while (local_128 != (ulong)puVar2 >> 6);
          }
        }
        return;
      }
      pdVar8 = vector->data;
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar29 = vector_00->data;
      if ((puVar6 == (unsigned_long *)0x0) || ((*puVar6 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar26 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_78);
          pdVar24 = local_e8.data;
          pSVar27 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar27;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar24;
          if ((p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var10.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar19->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var10.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var10.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar2 = (undefined1 *)
                     ((long)&count[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if (puVar2 < (undefined1 *)0x40) {
              return;
            }
            uVar23 = 0;
            pSVar27 = (SelectionVector *)0x0;
            do {
              puVar6 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar6 == (unsigned_long *)0x0) {
                pSVar20 = (SelectionVector *)
                          &pSVar27[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar20) {
                  pSVar20 = count;
                }
LAB_00ed4c0e:
                pSVar21 = pSVar27;
                if (pSVar27 < pSVar20) {
                  uVar13 = *(undefined8 *)pdVar8;
                  uVar14 = *(undefined8 *)(pdVar8 + 8);
                  do {
                    lVar18 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                       (uVar13,uVar14,*(undefined4 *)(pdVar29 + (long)pSVar27 * 4),
                                        pVVar1,pSVar27);
                    *(long *)(pdVar26 + (long)pSVar27 * 8) = lVar18;
                    pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
                    pSVar21 = pSVar20;
                  } while (pSVar20 != pSVar27);
                }
              }
              else {
                uVar28 = puVar6[uVar23];
                pSVar20 = (SelectionVector *)
                          &pSVar27[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar20) {
                  pSVar20 = count;
                }
                pSVar21 = pSVar20;
                if (uVar28 != 0) {
                  if (uVar28 == 0xffffffffffffffff) goto LAB_00ed4c0e;
                  pSVar21 = pSVar27;
                  if (pSVar27 < pSVar20) {
                    uVar25 = 0;
                    do {
                      if ((uVar28 >> (uVar25 & 0x3f) & 1) != 0) {
                        lVar18 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                           (*(undefined8 *)pdVar8,*(undefined8 *)(pdVar8 + 8),
                                            *(undefined4 *)
                                             (pdVar29 + uVar25 * 4 + (long)pSVar27 * 4),pVVar1,
                                            (long)&pSVar27->sel_vector + uVar25);
                        *(long *)(pdVar26 + uVar25 * 8 + (long)pSVar27 * 8) = lVar18;
                      }
                      uVar25 = uVar25 + 1;
                      pSVar21 = pSVar20;
                    } while ((long)pSVar20 - (long)pSVar27 != uVar25);
                  }
                }
              }
              uVar23 = uVar23 + 1;
              pSVar27 = pSVar21;
              if (uVar23 == (ulong)puVar2 >> 6) {
                return;
              }
            } while( true );
          }
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar13 = *(undefined8 *)pdVar8;
        uVar14 = *(undefined8 *)(pdVar8 + 8);
        pSVar27 = (SelectionVector *)0x0;
        do {
          lVar18 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                             (uVar13,uVar14,*(undefined4 *)(pdVar29 + (long)pSVar27 * 4),pVVar1,
                              pSVar27);
          *(long *)(pdVar26 + (long)pSVar27 * 8) = lVar18;
          pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
        } while (count != pSVar27);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}